

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGhsMultiGenerator::WriteFileHeader(cmGlobalGhsMultiGenerator *this,ostream *fout)

{
  ostream *poVar1;
  size_type __dnew;
  long local_48;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            (fout,"#!gbuild\n#\n# CMAKE generated file: DO NOT EDIT!\n# Generated by \"",0x40);
  local_48 = 0x11;
  local_40 = local_30;
  local_40 = (long *)std::__cxx11::string::_M_create((ulong *)&local_40,(ulong)&local_48);
  local_30[0] = local_48;
  *local_40 = 0x6948206e65657247;
  local_40[1] = 0x544c554d20736c6c;
  *(char *)(local_40 + 2) = 'I';
  local_38 = local_48;
  *(char *)((long)local_40 + local_48) = '\0';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(fout,(char *)local_40,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" Generator, CMake Version ",0x1b);
  cmVersion::GetMajorVersion();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_48 = CONCAT71(local_48._1_7_,0x2e);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_48,1);
  cmVersion::GetMinorVersion();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n#\n\n",4);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteFileHeader(std::ostream& fout)
{
  /* clang-format off */
  fout << "#!gbuild\n"
          "#\n"
          "# CMAKE generated file: DO NOT EDIT!\n"
          "# Generated by \"" << GetActualName() << "\""
          " Generator, CMake Version " << cmVersion::GetMajorVersion() << '.'
       << cmVersion::GetMinorVersion() << "\n"
          "#\n\n";
  /* clang-format on */
}